

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool __thiscall
Function_Template::form4_ProjectionProfile::anon_class_8_1_a8c68091::operator()
          (anon_class_8_1_a8c68091 *this,uint32_t v)

{
  uint32_t v_local;
  anon_class_8_1_a8c68091 *this_local;
  
  return *this->value == v;
}

Assistant:

bool form1_ReplaceChannel(ReplaceChannelForm1 ReplaceChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input = uniformImage( intensity[0] );
        PenguinV_Image::Image output( input.width(), input.height(), PenguinV_Image::RGB );

        output.fill( intensity[1] );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        ReplaceChannel( input, output, channelId );

        std::vector<uint8_t> verificationArray( 3, intensity[1] );
        verificationArray[channelId] = intensity[0];

        return verifyImage( output, verificationArray, false );
    }